

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O1

int mbedtls_poly1305_update(mbedtls_poly1305_context *ctx,uchar *input,size_t ilen)

{
  size_t sVar1;
  ulong __n;
  size_t __n_00;
  
  if (ilen == 0) {
LAB_001040c3:
    __n_00 = 0;
  }
  else {
    sVar1 = ctx->queue_len;
    __n_00 = ilen;
    if (sVar1 != 0) {
      __n = 0x10 - sVar1;
      __n_00 = ilen - __n;
      if (__n <= ilen) {
        memcpy(ctx->queue + sVar1,input,__n);
        ctx->queue_len = 0;
        poly1305_process(ctx,1,ctx->queue,1);
        goto LAB_001040c9;
      }
      memcpy(ctx->queue + sVar1,input,ilen);
      ctx->queue_len = ctx->queue_len + ilen;
      goto LAB_001040c3;
    }
  }
  __n = 0;
LAB_001040c9:
  if (0xf < __n_00) {
    poly1305_process(ctx,__n_00 >> 4,input + __n,1);
    __n = __n + (__n_00 & 0xfffffffffffffff0);
    __n_00 = (size_t)((uint)__n_00 & 0xf);
  }
  if (__n_00 != 0) {
    ctx->queue_len = __n_00;
    memcpy(ctx->queue,input + __n,__n_00);
  }
  return 0;
}

Assistant:

int mbedtls_poly1305_update( mbedtls_poly1305_context *ctx,
                             const unsigned char *input,
                             size_t ilen )
{
    size_t offset    = 0U;
    size_t remaining = ilen;
    size_t queue_free_len;
    size_t nblocks;
    POLY1305_VALIDATE_RET( ctx != NULL );
    POLY1305_VALIDATE_RET( ilen == 0 || input != NULL );

    if( ( remaining > 0U ) && ( ctx->queue_len > 0U ) )
    {
        queue_free_len = ( POLY1305_BLOCK_SIZE_BYTES - ctx->queue_len );

        if( ilen < queue_free_len )
        {
            /* Not enough data to complete the block.
             * Store this data with the other leftovers.
             */
            memcpy( &ctx->queue[ctx->queue_len],
                    input,
                    ilen );

            ctx->queue_len += ilen;

            remaining = 0U;
        }
        else
        {
            /* Enough data to produce a complete block */
            memcpy( &ctx->queue[ctx->queue_len],
                    input,
                    queue_free_len );

            ctx->queue_len = 0U;

            poly1305_process( ctx, 1U, ctx->queue, 1U ); /* add padding bit */

            offset    += queue_free_len;
            remaining -= queue_free_len;
        }
    }

    if( remaining >= POLY1305_BLOCK_SIZE_BYTES )
    {
        nblocks = remaining / POLY1305_BLOCK_SIZE_BYTES;

        poly1305_process( ctx, nblocks, &input[offset], 1U );

        offset += nblocks * POLY1305_BLOCK_SIZE_BYTES;
        remaining %= POLY1305_BLOCK_SIZE_BYTES;
    }

    if( remaining > 0U )
    {
        /* Store partial block */
        ctx->queue_len = remaining;
        memcpy( ctx->queue, &input[offset], remaining );
    }

    return( 0 );
}